

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

Vector * Sub_VV(Vector *V1,Vector *V2)

{
  double dVar1;
  double dVar2;
  Real *Dim_00;
  Real *pRVar3;
  Real *pRVar4;
  Real *pRVar5;
  LASErrIdType LVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  Real *VResCmp;
  Real *V2Cmp;
  Real *V1Cmp;
  size_t Ind;
  size_t Dim;
  double Multipl2;
  double Multipl1;
  char *VResName;
  Vector *VRes;
  Vector *V2_local;
  Vector *V1_local;
  
  V_Lock(V1);
  V_Lock(V2);
  LVar6 = LASResult();
  if (LVar6 == LASOK) {
    if (V1->Dim == V2->Dim) {
      Dim_00 = (Real *)V1->Dim;
      VResName = (char *)malloc(0x30);
      pcVar7 = V_GetName(V1);
      sVar8 = strlen(pcVar7);
      pcVar7 = V_GetName(V2);
      sVar9 = strlen(pcVar7);
      pcVar7 = (char *)malloc(sVar8 + sVar9 + 10);
      if (((Vector *)VResName == (Vector *)0x0) || (pcVar7 == (char *)0x0)) {
        pcVar10 = V_GetName(V1);
        pcVar11 = V_GetName(V2);
        LASError(LASMemAllocErr,"Sub_VV",pcVar10,pcVar11,(char *)0x0);
        if ((Vector *)VResName != (Vector *)0x0) {
          free(VResName);
        }
      }
      else {
        pcVar10 = V_GetName(V1);
        pcVar11 = V_GetName(V2);
        sprintf(pcVar7,"%s - %s",pcVar10,pcVar11);
        V_Constr((Vector *)VResName,pcVar7,(size_t)Dim_00,Tempor,True);
        LVar6 = LASResult();
        if (LVar6 == LASOK) {
          pRVar3 = V1->Cmp;
          pRVar4 = V2->Cmp;
          pRVar5 = ((Vector *)VResName)->Cmp;
          if (2.220446049250313e-15 <= ABS(V1->Multipl - 1.0)) {
            dVar1 = V1->Multipl;
            if (2.220446049250313e-15 <= ABS(V2->Multipl - 1.0)) {
              dVar2 = V2->Multipl;
              for (V1Cmp = (Real *)0x1; V1Cmp <= Dim_00; V1Cmp = (Real *)((long)V1Cmp + 1)) {
                pRVar5[(long)V1Cmp] = dVar1 * pRVar3[(long)V1Cmp] + -(dVar2 * pRVar4[(long)V1Cmp]);
              }
            }
            else {
              for (V1Cmp = (Real *)0x1; V1Cmp <= Dim_00; V1Cmp = (Real *)((long)V1Cmp + 1)) {
                pRVar5[(long)V1Cmp] = dVar1 * pRVar3[(long)V1Cmp] + -pRVar4[(long)V1Cmp];
              }
            }
          }
          else if (2.220446049250313e-15 <= ABS(V2->Multipl - 1.0)) {
            dVar1 = V2->Multipl;
            for (V1Cmp = (Real *)0x1; V1Cmp <= Dim_00; V1Cmp = (Real *)((long)V1Cmp + 1)) {
              pRVar5[(long)V1Cmp] = -dVar1 * pRVar4[(long)V1Cmp] + pRVar3[(long)V1Cmp];
            }
          }
          else {
            for (V1Cmp = (Real *)0x1; V1Cmp <= Dim_00; V1Cmp = (Real *)((long)V1Cmp + 1)) {
              pRVar5[(long)V1Cmp] = pRVar3[(long)V1Cmp] - pRVar4[(long)V1Cmp];
            }
          }
        }
      }
      if (pcVar7 != (char *)0x0) {
        free(pcVar7);
      }
    }
    else {
      pcVar7 = V_GetName(V1);
      pcVar10 = V_GetName(V2);
      LASError(LASDimErr,"Sub_VV",pcVar7,pcVar10,(char *)0x0);
      VResName = (char *)0x0;
    }
  }
  else {
    VResName = (char *)0x0;
  }
  V_Unlock(V1);
  V_Unlock(V2);
  return (Vector *)VResName;
}

Assistant:

Vector *Sub_VV(Vector *V1, Vector *V2)
/* VRes = V1 - V2 */
{
    Vector *VRes;

    char *VResName;
    double Multipl1, Multipl2;
    size_t Dim, Ind;
    Real *V1Cmp, *V2Cmp, *VResCmp;

    V_Lock(V1);
    V_Lock(V2);
    
    if (LASResult() == LASOK) {
        if (V1->Dim == V2->Dim) {
            Dim = V1->Dim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(V_GetName(V1)) + strlen(V_GetName(V2)) + 10)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "%s - %s", V_GetName(V1), V_GetName(V2));
                V_Constr(VRes, VResName, Dim, Tempor, True);
                if (LASResult() == LASOK) {
                    V1Cmp = V1->Cmp;
                    V2Cmp = V2->Cmp;
                    VResCmp = VRes->Cmp;
                    if (IsOne(V1->Multipl)) {
                        if (IsOne(V2->Multipl)) {
                           for_AllCmp
                                VResCmp[Ind] = V1Cmp[Ind] - V2Cmp[Ind];
                        } else {
                            Multipl2 = V2->Multipl;
                            for_AllCmp
                                VResCmp[Ind] = V1Cmp[Ind] - Multipl2 * V2Cmp[Ind];
                        }
                    } else {
                        Multipl1 = V1->Multipl;
                        if (IsOne(V2->Multipl)) {
                           for_AllCmp
                                VResCmp[Ind] = Multipl1 * V1Cmp[Ind] - V2Cmp[Ind];
                        } else {
                            Multipl2 = V2->Multipl;
                            for_AllCmp
                                VResCmp[Ind] = Multipl1 * V1Cmp[Ind] - Multipl2 * V2Cmp[Ind];
                        }
                    }
                }
            } else {
                LASError(LASMemAllocErr, "Sub_VV", V_GetName(V1), V_GetName(V2), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "Sub_VV", V_GetName(V1), V_GetName(V2), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    V_Unlock(V1);
    V_Unlock(V2);

    return(VRes);
}